

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep.h
# Opt level: O2

void __thiscall Dyndeps::Dyndeps(Dyndeps *this,Dyndeps *param_2)

{
  pointer ppNVar1;
  bool bVar2;
  
  bVar2 = param_2->restat_;
  this->used_ = param_2->used_;
  this->restat_ = bVar2;
  ppNVar1 = (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  (this->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppNVar1;
  (this->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->implicit_inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppNVar1 = (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  (this->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  (this->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppNVar1;
  (this->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (param_2->implicit_outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Dyndeps() : used_(false), restat_(false) {}